

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall deqp::egl::GLES2ThreadTest::LinkProgram::exec(LinkProgram *this,Thread *t)

{
  ostream *poVar1;
  GLuint GVar2;
  deUint32 err;
  Thread *pTVar3;
  undefined1 local_1b0 [400];
  
  pTVar3 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (pTVar3 != (Thread *)0x0) {
    GVar2 = ((this->m_program).m_ptr)->program;
    local_1b0._0_8_ = pTVar3;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    poVar1 = (ostream *)(local_1b0 + 0x18);
    std::operator<<(poVar1,"Begin -- glLinkProgram(");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,")");
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    (**(code **)(*(long *)&pTVar3[1].super_Thread.m_attribs + 0xce8))(GVar2);
    err = (**(code **)(*(long *)&pTVar3[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(err,"linkProgram(program)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x67b);
    local_1b0._0_8_ = pTVar3;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 0x18),"End -- glLinkProgram()");
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void LinkProgram::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);
	GLuint program = m_program->program;

	thread.newMessage() << "Begin -- glLinkProgram(" << program << ")" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, linkProgram(program));
	thread.newMessage() << "End -- glLinkProgram()" << tcu::ThreadUtil::Message::End;
}